

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<float>_>::TPZVec
          (TPZVec<TPZEqnArray<float>_> *this,TPZVec<TPZEqnArray<float>_> *rval)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  TPZEqnArray<float> *this_00;
  TPZStack<int,_100> *pTVar4;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  int64_t i;
  TPZEqnArray<float> *in_stack_ffffffffffffff88;
  TPZEqnArray<float> *in_stack_ffffffffffffff90;
  TPZStack<int,_100> *local_58;
  long local_28;
  
  *in_RDI = &PTR__TPZVec_02550328;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  if (*(long *)(in_RSI + 0x18) == 0) {
    uVar1 = in_RDI[2];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x22f0),0);
    uVar5 = uVar3 + 8;
    if (SUB168(auVar2 * ZEXT816(0x22f0),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar5 = 0xffffffffffffffff;
    }
    this_00 = (TPZEqnArray<float> *)operator_new__(uVar5);
    this_00->fSymmetric = (int)uVar1;
    this_00->fNumEq = (int)(uVar1 >> 0x20);
    pTVar4 = &this_00->fEqStart;
    if (uVar1 != 0) {
      local_58 = pTVar4;
      do {
        TPZEqnArray<float>::TPZEqnArray(this_00);
        local_58 = (TPZStack<int,_100> *)((long)(local_58 + 0x14) + 0x130);
      } while (local_58 != (TPZStack<int,_100> *)((long)pTVar4 + uVar1 * 0x22f0));
    }
    in_RDI[1] = pTVar4;
    for (local_28 = 0; local_28 < (long)in_RDI[2]; local_28 = local_28 + 1) {
      TPZEqnArray<float>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  else {
    in_RDI[1] = *(undefined8 *)(in_RSI + 8);
    in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
    *(undefined8 *)(in_RSI + 8) = 0;
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}